

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::StructUnionTypeSyntax::isKind(SyntaxKind kind)

{
  return kind == UnionType || kind == StructType;
}

Assistant:

bool StructUnionTypeSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::StructType:
        case SyntaxKind::UnionType:
            return true;
        default:
            return false;
    }
}